

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void deqp::gles3::Performance::anon_unknown_1::generateTwoPassRandomIterationOrder
               (vector<int,_std::allocator<int>_> *iterationOrder,int numSamples)

{
  int iVar1;
  pointer piVar2;
  deUint32 dVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  pointer piVar8;
  Random rnd;
  deRandom local_40;
  
  deRandom_init(&local_40,0xabc);
  iVar1 = numSamples + 1;
  uVar5 = (numSamples - (iVar1 >> 0x1f)) + 1 >> 1;
  if (1 < iVar1) {
    piVar8 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    uVar6 = (ulong)uVar5;
    do {
      *(int *)((long)piVar8 + lVar4 * 2) = (int)lVar4;
      lVar4 = lVar4 + 2;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  if ((int)uVar5 < numSamples) {
    piVar8 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(int)uVar5;
    iVar7 = 1;
    do {
      piVar8[lVar4] = iVar7;
      lVar4 = lVar4 + 1;
      iVar7 = iVar7 + 2;
    } while (numSamples != lVar4);
  }
  if (1 < iVar1) {
    uVar6 = 0;
    do {
      piVar8 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar3 = deRandom_getUint32(&local_40);
      piVar2 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar8[uVar6];
      piVar8[uVar6] = piVar2[(ulong)dVar3 % (ulong)uVar5];
      piVar2[(ulong)dVar3 % (ulong)uVar5] = iVar1;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  piVar8 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar8) >> 2;
  if ((int)uVar5 < (int)uVar6) {
    lVar4 = (long)(int)uVar5;
    do {
      dVar3 = deRandom_getUint32(&local_40);
      iVar7 = dVar3 % ((int)uVar6 - uVar5) + uVar5;
      piVar2 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar8[lVar4];
      piVar8[lVar4] = piVar2[iVar7];
      piVar2[iVar7] = iVar1;
      lVar4 = lVar4 + 1;
      piVar8 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = (ulong)((long)(iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar8) >> 2;
    } while (lVar4 < (int)uVar6);
  }
  return;
}

Assistant:

static void generateTwoPassRandomIterationOrder (std::vector<int>& iterationOrder, int numSamples)
{
	de::Random	rnd			(0xabc);
	const int	midPoint	= (numSamples+1) / 2;		// !< ceil(m_numSamples / 2)

	DE_ASSERT((int)iterationOrder.size() == numSamples);

	// Two "passes" over range, randomize order in both passes
	// This allows to us detect if iterations are not independent
	// (first run and later run samples differ significantly?)

	for (int sampleNdx = 0; sampleNdx < midPoint; ++sampleNdx)
		iterationOrder[sampleNdx] = sampleNdx * 2;
	for (int sampleNdx = midPoint; sampleNdx < numSamples; ++sampleNdx)
		iterationOrder[sampleNdx] = (sampleNdx - midPoint) * 2 + 1;

	for (int ndx = 0; ndx < midPoint; ++ndx)
		std::swap(iterationOrder[ndx], iterationOrder[rnd.getInt(0, midPoint - 1)]);
	for (int ndx = midPoint; ndx < (int)iterationOrder.size(); ++ndx)
		std::swap(iterationOrder[ndx], iterationOrder[rnd.getInt(midPoint, (int)iterationOrder.size()-1)]);
}